

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O0

void M_SaveCustomKeys(FConfigFile *config,char *section,char *subsection,size_t sublen)

{
  uint uVar1;
  FKeySection *pFVar2;
  char *pcVar3;
  uint local_2c;
  uint i;
  size_t sublen_local;
  char *subsection_local;
  char *section_local;
  FConfigFile *config_local;
  
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<FKeySection,_FKeySection>::Size(&KeySections);
    if (uVar1 <= local_2c) break;
    pFVar2 = TArray<FKeySection,_FKeySection>::operator[](&KeySections,(ulong)local_2c);
    FString::GetChars(&pFVar2->mSection);
    mysnprintf(subsection,sublen,"%s.Bindings");
    pFVar2 = TArray<FKeySection,_FKeySection>::operator[](&KeySections,(ulong)local_2c);
    DoSaveKeys(config,section,pFVar2,false);
    pFVar2 = TArray<FKeySection,_FKeySection>::operator[](&KeySections,(ulong)local_2c);
    pcVar3 = FString::GetChars(&pFVar2->mSection);
    mysnprintf(subsection,sublen,"%s.DoubleBindings",pcVar3);
    pFVar2 = TArray<FKeySection,_FKeySection>::operator[](&KeySections,(ulong)local_2c);
    DoSaveKeys(config,section,pFVar2,true);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void M_SaveCustomKeys (FConfigFile *config, char *section, char *subsection, size_t sublen)
{
	for (unsigned i=0; i<KeySections.Size(); i++)
	{
		mysnprintf (subsection, sublen, "%s.Bindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], false);
		mysnprintf (subsection, sublen, "%s.DoubleBindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], true);
	}
}